

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O2

void anon_unknown.dwarf_2b49be::writeCopyRead(string *tempDir,int w,int h,int xs,int ys)

{
  undefined4 uVar1;
  undefined1 *puVar2;
  Rand32 RVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ostream *poVar20;
  uint *puVar21;
  undefined4 *puVar22;
  char *pcVar23;
  int *piVar24;
  Box<Imath_3_2::Vec2<int>_> *pBVar25;
  Box<Imath_3_2::Vec2<int>_> *pBVar26;
  float *pfVar27;
  float *pfVar28;
  ChannelList *pCVar29;
  ChannelList *pCVar30;
  uint uVar31;
  half *phVar32;
  ulong uVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int tileY;
  int iVar38;
  pointer piVar39;
  int tileY_5;
  Array2D<Imath_3_2::half> *this;
  long lVar40;
  ulong uVar41;
  int tileX;
  long lVar42;
  long lVar43;
  ulong uVar44;
  int tileX_2;
  ulong uVar45;
  float fVar46;
  vector<int,_std::allocator<int>_> tileXs;
  Array2D<Imath_3_2::half> ph1;
  FrameBuffer fb;
  int local_160;
  TiledOutputFile out;
  allocator_type local_109;
  Rand32 rand1;
  Rand32 rand1_2;
  Header hdr;
  Rand32 rand1_1;
  vector<int,_std::allocator<int>_> tileYs;
  string filename;
  
  std::operator+(&filename,tempDir,"imf_test_copy.exr");
  uVar31 = 0;
  do {
    if (uVar31 == 10) {
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    if ((uVar31 & 0xe) != 6) {
      for (uVar7 = 0; uVar7 != 2; uVar7 = uVar7 + 1) {
        for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
          for (iVar36 = 0; iVar36 != 2; iVar36 = iVar36 + 1) {
            for (iVar35 = 0; _Var4._M_p = filename._M_dataplus._M_p, iVar35 != 2;
                iVar35 = iVar35 + 1) {
              poVar20 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar7);
              poVar20 = std::operator<<(poVar20,", buffer ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", seek ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", levelMode 0, ");
              poVar20 = std::operator<<(poVar20,"roundingMode ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar8);
              poVar20 = std::operator<<(poVar20,", compression ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar31);
              std::endl<char,std::char_traits<char>>(poVar20);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar21 = (uint *)Imf_3_4::Header::compression();
              *puVar21 = uVar31;
              puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar22 = 0;
              pcVar23 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              ph1._sizeX = 0x103;
              ph1._sizeY = 0xab;
              ph1._data = (half *)operator_new__(0x15a02);
              fillPixels(&ph1,0xab,0x103);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_4::Slice::Slice
                        ((Slice *)&out,HALF,(char *)ph1._data,2,0x156,1,1,0.0,false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar9 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile(&out,_Var4._M_p,&hdr,iVar9);
              Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
              rand1._state = (unsigned_long)&DAT_5a5a5a5a;
              iVar9 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileYs,(long)iVar9,(allocator_type *)&tileXs);
              iVar9 = Imf_3_4::TiledOutputFile::numXTiles((int)&out);
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar9,(allocator_type *)&rand1_1);
              iVar9 = -1;
              for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                  lVar42 < iVar10; lVar42 = lVar42 + 1) {
                if (uVar7 == 1) {
                  iVar10 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar10 + iVar9] = (int)lVar42;
                }
                else {
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar42] = (int)lVar42;
                }
                iVar9 = iVar9 + -1;
              }
              for (lVar42 = 0; iVar9 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                  lVar42 < iVar9; lVar42 = lVar42 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar42] = (int)lVar42;
              }
              if (iVar36 != 0) {
                for (lVar42 = 0; iVar9 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                    piVar39 = tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar42 < iVar9; lVar42 = lVar42 + 1)
                {
                  iVar9 = Imf_3_4::TiledOutputFile::numYTiles((int)&out);
                  fVar46 = Imath_3_2::Rand32::nextf(&rand1,(float)(int)lVar42,(float)(iVar9 + -1));
                  iVar9 = piVar39[lVar42];
                  piVar39[lVar42] =
                       tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)];
                  tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)] = iVar9;
                }
                for (lVar42 = 0; iVar9 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                    piVar39 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar42 < iVar9; lVar42 = lVar42 + 1)
                {
                  iVar9 = Imf_3_4::TiledOutputFile::numXTiles((int)&out);
                  fVar46 = Imath_3_2::Rand32::nextf(&rand1,(float)(int)lVar42,(float)(iVar9 + -1));
                  iVar9 = piVar39[lVar42];
                  piVar39[lVar42] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)] = iVar9;
                }
              }
              for (lVar42 = 0; iVar9 = Imf_3_4::TiledOutputFile::numYTiles((int)&out),
                  lVar42 < iVar9; lVar42 = lVar42 + 1) {
                for (lVar43 = 0; iVar9 = Imf_3_4::TiledOutputFile::numXTiles((int)&out),
                    lVar43 < iVar9; lVar43 = lVar43 + 1) {
                  Imf_3_4::TiledOutputFile::writeTile
                            ((int)&out,
                             tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar43],
                             tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar42]);
                }
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&tileYs);
              Imf_3_4::TiledOutputFile::~TiledOutputFile(&out);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar9 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var4._M_p,iVar9);
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::dataWindow();
              iVar9 = *piVar24;
              lVar43 = (long)piVar24[2] - (long)iVar9;
              lVar42 = lVar43 + 1;
              iVar10 = piVar24[1];
              lVar40 = (long)piVar24[3] - (long)iVar10;
              Imf_3_4::Array2D<Imath_3_2::half>::Array2D
                        ((Array2D<Imath_3_2::half> *)&tileXs,lVar40 + 1,lVar42);
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_3_4::Slice::Slice
                        ((Slice *)&out,HALF,
                         (char *)((long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_end_of_storage +
                                 (long)iVar9 * -2 +
                                 -(long)iVar10 *
                                 (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish * 2),2,lVar42 * 2,1,1,0.0,
                         false,false);
              Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
              Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
              uVar11 = (uint)(iVar35 == 0);
              iVar9 = (int)(TiledInputFile *)&tileYs;
              if (uVar7 == uVar11) {
                iVar12 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                iVar12 = iVar12 + -1;
                iVar10 = -1;
                iVar14 = -1;
              }
              else {
                iVar12 = 0;
                iVar14 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                iVar10 = 1;
              }
              for (; iVar12 != iVar14; iVar12 = iVar12 + iVar10) {
                for (iVar15 = 0; iVar16 = Imf_3_4::TiledInputFile::numXTiles(iVar9), iVar15 < iVar16
                    ; iVar15 = iVar15 + 1) {
                  Imf_3_4::TiledInputFile::readTile(iVar9,iVar15,iVar12);
                }
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb7,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb8,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xb9,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
                  (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbb,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbc,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbd,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::compression();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::compression();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbe,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
              cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0xbf,
                              "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              local_160 = (int)lVar43;
              phVar32 = ph1._data;
              piVar39 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              for (lVar42 = 0; lVar42 <= (int)lVar40; lVar42 = lVar42 + 1) {
                lVar43 = 0;
                while (lVar43 <= local_160) {
                  fVar46 = *(float *)(_imath_half_to_float_table + (ulong)phVar32[lVar43]._h * 4);
                  lVar37 = lVar43 * 2;
                  lVar43 = lVar43 + 1;
                  pfVar27 = (float *)(_imath_half_to_float_table +
                                     (ulong)*(ushort *)((long)piVar39 + lVar37) * 4);
                  if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                    __assert_fail("ph1[y][x] == ph2[y][x]",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                  ,0xc3,
                                  "void (anonymous namespace)::writeCopyReadONE(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                 );
                  }
                }
                piVar39 = (pointer)((long)piVar39 +
                                   (long)tileXs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish * 2);
                phVar32 = phVar32 + ph1._sizeY;
              }
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&fb);
              Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&tileXs);
              Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileYs);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&ph1);
              Imf_3_4::Header::~Header(&hdr);
              _Var4 = filename._M_dataplus;
              poVar20 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar7);
              poVar20 = std::operator<<(poVar20,", buffer ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", seek ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", levelMode 1, ");
              poVar20 = std::operator<<(poVar20,"roundingMode ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar8);
              poVar20 = std::operator<<(poVar20,", compression ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar31);
              std::endl<char,std::char_traits<char>>(poVar20);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar21 = (uint *)Imf_3_4::Header::compression();
              *puVar21 = uVar31;
              puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar22 = 0;
              pcVar23 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              rand1._state = 0;
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar10 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&tileYs,_Var4._M_p,&hdr,iVar10);
              uVar13 = Imf_3_4::TiledOutputFile::numLevels();
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&rand1,(long)(int)uVar13);
              rand1_1._state = (unsigned_long)&DAT_5a5a5a5a;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&ph1,(long)(int)uVar13,
                         (allocator_type *)&out);
              uVar41 = 0;
              if (0 < (int)uVar13) {
                uVar41 = (ulong)uVar13;
              }
              for (uVar33 = 0; uVar41 != uVar33; uVar33 = uVar33 + 1) {
                *(int *)(ph1._sizeX + uVar33 * 4) = (int)uVar33;
              }
              if (iVar36 != 0) {
                for (uVar33 = 0; lVar42 = ph1._sizeX, uVar41 != uVar33; uVar33 = uVar33 + 1) {
                  fVar46 = Imath_3_2::Rand32::nextf
                                     (&rand1_1,(float)(int)uVar33,(float)(int)(uVar13 - 1));
                  uVar1 = *(undefined4 *)(lVar42 + uVar33 * 4);
                  *(undefined4 *)(lVar42 + uVar33 * 4) =
                       *(undefined4 *)(ph1._sizeX + (long)(int)(fVar46 + 0.5) * 4);
                  *(undefined4 *)(ph1._sizeX + (long)(int)(fVar46 + 0.5) * 4) = uVar1;
                }
              }
              for (uVar33 = 0; uVar33 != uVar41; uVar33 = uVar33 + 1) {
                iVar10 = *(int *)(ph1._sizeX + uVar33 * 4);
                iVar12 = Imf_3_4::TiledOutputFile::levelWidth(iVar9);
                iVar14 = Imf_3_4::TiledOutputFile::levelHeight(iVar9);
                this = (Array2D<Imath_3_2::half> *)((long)iVar10 * 0x18);
                Imf_3_4::Array2D<Imath_3_2::half>::resizeErase(this,(long)iVar14,(long)iVar12);
                fillPixels(this,iVar12,iVar14);
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_4::Slice::Slice
                          ((Slice *)&out,HALF,(char *)this->_data,2,(long)iVar12 * 2,1,1,0.0,false,
                           false);
                Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
                Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&out,(long)iVar10,
                           (allocator_type *)&tileXs);
                iVar10 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          (&tileXs,(long)iVar10,(allocator_type *)&rand1_2);
                iVar10 = -1;
                for (lVar42 = 0; iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                    lVar42 < iVar12; lVar42 = lVar42 + 1) {
                  if (uVar7 == 1) {
                    iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                    *(int *)(_out + (long)(iVar12 + iVar10) * 4) = (int)lVar42;
                  }
                  else {
                    *(int *)(_out + lVar42 * 4) = (int)lVar42;
                  }
                  iVar10 = iVar10 + -1;
                }
                for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                    lVar42 < iVar10; lVar42 = lVar42 + 1) {
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar42] = (int)lVar42;
                }
                if (iVar36 != 0) {
                  for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                      puVar2 = _out, lVar42 < iVar10; lVar42 = lVar42 + 1) {
                    iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                    fVar46 = Imath_3_2::Rand32::nextf
                                       (&rand1_1,(float)(int)lVar42,(float)(iVar10 + -1));
                    uVar1 = *(undefined4 *)(puVar2 + lVar42 * 4);
                    *(undefined4 *)(puVar2 + lVar42 * 4) =
                         *(undefined4 *)(_out + (long)(int)(fVar46 + 0.5) * 4);
                    *(undefined4 *)(_out + (long)(int)(fVar46 + 0.5) * 4) = uVar1;
                  }
                  for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                      piVar39 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start, lVar42 < iVar10;
                      lVar42 = lVar42 + 1) {
                    iVar10 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
                    fVar46 = Imath_3_2::Rand32::nextf
                                       (&rand1_1,(float)(int)lVar42,(float)(iVar10 + -1));
                    iVar10 = piVar39[lVar42];
                    piVar39[lVar42] =
                         tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)];
                    tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)] = iVar10;
                  }
                }
                for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                    lVar42 < iVar10; lVar42 = lVar42 + 1) {
                  for (lVar43 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                      lVar43 < iVar10; lVar43 = lVar43 + 1) {
                    Imf_3_4::TiledOutputFile::writeTile
                              (iVar9,tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar43],
                               *(int *)(_out + lVar42 * 4));
                  }
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&out);
                std::
                _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                             *)&fb);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&ph1);
              Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&tileYs);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar10 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var4._M_p,iVar10);
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::dataWindow();
              iVar10 = *piVar24;
              iVar12 = piVar24[1];
              uVar13 = Imf_3_4::TiledInputFile::numLevels();
              uVar41 = (ulong)uVar13;
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1,(long)(int)uVar13);
              for (lVar42 = 0; iVar14 = Imf_3_4::TiledInputFile::numLevels(), lVar42 < iVar14;
                  lVar42 = lVar42 + 1) {
                iVar14 = Imf_3_4::TiledInputFile::levelWidth(iVar9);
                iVar15 = Imf_3_4::TiledInputFile::levelHeight(iVar9);
                lVar43 = lVar42 * 0x18;
                Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                          ((Array2D<Imath_3_2::half> *)(ph1._sizeY + lVar43),(long)iVar15,
                           (long)iVar14);
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
                ;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                Imf_3_4::Slice::Slice
                          ((Slice *)&out,HALF,
                           (char *)(*(long *)(ph1._sizeY + 8 + lVar43) * -(long)iVar12 * 2 +
                                    *(long *)(ph1._sizeY + 0x10 + lVar43) + (long)iVar10 * -2),2,
                           (long)iVar14 * 2,1,1,0.0,false,false);
                Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
                Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                if (uVar7 == uVar11) {
                  iVar15 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                  iVar15 = iVar15 + -1;
                  iVar14 = -1;
                  iVar16 = -1;
                }
                else {
                  iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                  iVar15 = 0;
                  iVar14 = 1;
                }
                for (; iVar15 != iVar16; iVar15 = iVar15 + iVar14) {
                  for (iVar38 = 0; iVar17 = Imf_3_4::TiledInputFile::numXTiles(iVar9),
                      iVar38 < iVar17; iVar38 = iVar38 + 1) {
                    Imf_3_4::TiledInputFile::readTile(iVar9,iVar38,iVar15);
                  }
                }
                std::
                _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                             *)&fb);
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17b,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17c,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17d,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
                  (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x17f,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x180,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x181,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::compression();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::compression();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x182,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
              cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x183,
                              "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              if ((int)uVar13 < 1) {
                uVar41 = 0;
              }
              for (uVar33 = 0; uVar33 != uVar41; uVar33 = uVar33 + 1) {
                lVar42 = 0;
                for (lVar43 = 0; iVar10 = Imf_3_4::TiledInputFile::levelHeight(iVar9),
                    lVar43 < iVar10; lVar43 = lVar43 + 1) {
                  lVar40 = 0;
                  while (iVar10 = Imf_3_4::TiledInputFile::levelWidth(iVar9), lVar40 < iVar10) {
                    lVar34 = uVar33 * 0x18;
                    fVar46 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               (*(long *)(ph1._sizeY + 8 + lVar34) * lVar42 +
                                                *(long *)(ph1._sizeY + 0x10 + lVar34) + lVar40 * 2)
                                       * 4);
                    lVar37 = lVar40 * 2;
                    lVar40 = lVar40 + 1;
                    pfVar27 = (float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               (*(long *)(lVar34 + 8) * lVar42 +
                                                *(long *)(lVar34 + 0x10) + lVar37) * 4);
                    if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                      __assert_fail("(levels2[l])[y][x] == (levels[l])[y][x]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                    ,0x188,
                                    "void (anonymous namespace)::writeCopyReadMIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                   );
                    }
                  }
                  lVar42 = lVar42 + 2;
                }
              }
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
              Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileYs);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array
                        ((Array<Imf_3_4::Array2D<Imath_3_2::half>_> *)&rand1);
              Imf_3_4::Header::~Header(&hdr);
              _Var4 = filename._M_dataplus;
              poVar20 = std::operator<<((ostream *)&std::cout,"LineOrder ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar7);
              poVar20 = std::operator<<(poVar20,", buffer ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", seek ");
              poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
              poVar20 = std::operator<<(poVar20,", levelMode 2, ");
              poVar20 = std::operator<<(poVar20,"roundingMode ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar8);
              poVar20 = std::operator<<(poVar20,", compression ");
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar31);
              std::endl<char,std::char_traits<char>>(poVar20);
              _out = (undefined1 *)0x0;
              fb._map._M_t._M_impl._0_8_ = 0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaa;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x102;
              tileYs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              Imf_3_4::Header::Header
                        (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&tileYs,1.0,INCREASING_Y,
                         ZIP_COMPRESSION);
              puVar21 = (uint *)Imf_3_4::Header::compression();
              *puVar21 = uVar31;
              puVar22 = (undefined4 *)Imf_3_4::Header::lineOrder();
              *puVar22 = 0;
              pcVar23 = (char *)Imf_3_4::Header::channels();
              Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
              Imf_3_4::ChannelList::insert(pcVar23,(Channel *)0x1a5faf);
              _out = &DAT_3700000037;
              Imf_3_4::Header::setTileDescription((TileDescription *)&hdr);
              ph1._sizeX = 0;
              ph1._sizeY = 0;
              ph1._data = (half *)0x0;
              std::operator<<((ostream *)&std::cout," writing");
              std::ostream::flush();
              remove(_Var4._M_p);
              iVar10 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledOutputFile::TiledOutputFile
                        ((TiledOutputFile *)&tileYs,_Var4._M_p,&hdr,iVar10);
              iVar10 = Imf_3_4::TiledOutputFile::numYLevels();
              iVar12 = Imf_3_4::TiledOutputFile::numXLevels();
              Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
                        ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1,(long)iVar10,
                         (long)iVar12);
              rand1_2._state = (unsigned_long)&DAT_5a5a5a5a;
              iVar10 = Imf_3_4::TiledOutputFile::numXLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        (&tileXs,(long)iVar10,(allocator_type *)&out);
              iVar10 = Imf_3_4::TiledOutputFile::numYLevels();
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&rand1,(long)iVar10,
                         (allocator_type *)&out);
              for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXLevels(), lVar42 < iVar10;
                  lVar42 = lVar42 + 1) {
                tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[lVar42] = (int)lVar42;
              }
              for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYLevels(), lVar42 < iVar10;
                  lVar42 = lVar42 + 1) {
                *(int *)(rand1._state + lVar42 * 4) = (int)lVar42;
              }
              if (iVar36 != 0) {
                for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXLevels(),
                    piVar39 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start, lVar42 < iVar10; lVar42 = lVar42 + 1
                    ) {
                  iVar10 = Imf_3_4::TiledOutputFile::numXLevels();
                  fVar46 = Imath_3_2::Rand32::nextf
                                     (&rand1_2,(float)(int)lVar42,(float)(iVar10 + -1));
                  iVar10 = piVar39[lVar42];
                  piVar39[lVar42] =
                       tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)];
                  tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)(fVar46 + 0.5)] = iVar10;
                }
                for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYLevels(), RVar3 = rand1,
                    lVar42 < iVar10; lVar42 = lVar42 + 1) {
                  iVar10 = Imf_3_4::TiledOutputFile::numYLevels();
                  fVar46 = Imath_3_2::Rand32::nextf
                                     (&rand1_2,(float)(int)lVar42,(float)(iVar10 + -1));
                  uVar1 = *(undefined4 *)(RVar3._state + lVar42 * 4);
                  *(undefined4 *)(RVar3._state + lVar42 * 4) =
                       *(undefined4 *)(rand1._state + (long)(int)(fVar46 + 0.5) * 4);
                  *(undefined4 *)(rand1._state + (long)(int)(fVar46 + 0.5) * 4) = uVar1;
                }
              }
              for (lVar42 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYLevels(), lVar42 < iVar10;
                  lVar42 = lVar42 + 1) {
                iVar10 = *(int *)(rand1._state + lVar42 * 4);
                iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&rand1_1,(long)iVar12,
                           (allocator_type *)&out);
                lVar43 = (long)iVar10;
                iVar10 = -1;
                for (lVar40 = 0; iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                    lVar40 < iVar12; lVar40 = lVar40 + 1) {
                  if (uVar7 == 1) {
                    iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                    *(int *)(rand1_1._state + (long)(iVar12 + iVar10) * 4) = (int)lVar40;
                  }
                  else {
                    *(int *)(rand1_1._state + lVar40 * 4) = (int)lVar40;
                  }
                  iVar10 = iVar10 + -1;
                }
                if (iVar36 != 0) {
                  for (lVar40 = 0; iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                      RVar3 = rand1_1, lVar40 < iVar10; lVar40 = lVar40 + 1) {
                    iVar10 = Imf_3_4::TiledOutputFile::numYTiles(iVar9);
                    fVar46 = Imath_3_2::Rand32::nextf
                                       (&rand1_2,(float)(int)lVar40,(float)(iVar10 + -1));
                    uVar1 = *(undefined4 *)(RVar3._state + lVar40 * 4);
                    *(undefined4 *)(RVar3._state + lVar40 * 4) =
                         *(undefined4 *)(rand1_1._state + (long)(int)(fVar46 + 0.5) * 4);
                    *(undefined4 *)(rand1_1._state + (long)(int)(fVar46 + 0.5) * 4) = uVar1;
                  }
                }
                for (lVar40 = 0; iVar10 = Imf_3_4::TiledOutputFile::numXLevels(), lVar40 < iVar10;
                    lVar40 = lVar40 + 1) {
                  iVar10 = tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar40];
                  iVar12 = Imf_3_4::TiledOutputFile::levelWidth(iVar9);
                  iVar14 = Imf_3_4::TiledOutputFile::levelHeight(iVar9);
                  lVar37 = (long)iVar10;
                  Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                            ((Array2D<Imath_3_2::half> *)
                             (ph1._data + ph1._sizeY * lVar43 * 0xc + lVar37 * 0xc),(long)iVar14,
                             (long)iVar12);
                  fillPixels((Array2D<Imath_3_2::half> *)
                             (ph1._data + ph1._sizeY * lVar43 * 0xc + lVar37 * 0xc),iVar12,iVar14);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&out,HALF,
                             *(char **)(ph1._data + ph1._sizeY * lVar43 * 0xc + lVar37 * 0xc + 8),2,
                             (long)iVar12 * 2,1,1,0.0,false,false);
                  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
                  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                  iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&out,(long)iVar12,&local_109);
                  for (lVar37 = 0; iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                      lVar37 < iVar12; lVar37 = lVar37 + 1) {
                    *(int *)(_out + lVar37 * 4) = (int)lVar37;
                  }
                  if (iVar36 != 0) {
                    for (lVar37 = 0; iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                        puVar2 = _out, lVar37 < iVar12; lVar37 = lVar37 + 1) {
                      iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar9);
                      fVar46 = Imath_3_2::Rand32::nextf
                                         (&rand1_2,(float)(int)lVar37,(float)(iVar12 + -1));
                      uVar1 = *(undefined4 *)(puVar2 + lVar37 * 4);
                      *(undefined4 *)(puVar2 + lVar37 * 4) =
                           *(undefined4 *)(_out + (long)(int)(fVar46 + 0.5) * 4);
                      *(undefined4 *)(_out + (long)(int)(fVar46 + 0.5) * 4) = uVar1;
                    }
                  }
                  for (lVar37 = 0; iVar12 = Imf_3_4::TiledOutputFile::numYTiles(iVar9),
                      lVar37 < iVar12; lVar37 = lVar37 + 1) {
                    for (lVar34 = 0; iVar12 = Imf_3_4::TiledOutputFile::numXTiles(iVar9),
                        lVar34 < iVar12; lVar34 = lVar34 + 1) {
                      Imf_3_4::TiledOutputFile::writeTile
                                (iVar9,*(int *)(_out + lVar34 * 4),
                                 *(int *)(rand1_1._state + lVar37 * 4),iVar10);
                    }
                  }
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                            ((_Vector_base<int,_std::allocator<int>_> *)&out);
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&fb);
                }
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&rand1_1);
              }
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&rand1);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&tileXs.super__Vector_base<int,_std::allocator<int>_>);
              Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&tileYs);
              std::operator<<((ostream *)&std::cout," reading");
              std::ostream::flush();
              iVar10 = Imf_3_4::globalThreadCount();
              Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&tileYs,_Var4._M_p,iVar10);
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::dataWindow();
              iVar10 = *piVar24;
              iVar12 = piVar24[1];
              uVar13 = Imf_3_4::TiledInputFile::numXLevels();
              uVar18 = Imf_3_4::TiledInputFile::numYLevels();
              Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
                        ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&tileXs,(long)(int)uVar18,
                         (long)(int)uVar13);
              for (lVar42 = 0; iVar14 = Imf_3_4::TiledInputFile::numYLevels(), lVar42 < iVar14;
                  lVar42 = lVar42 + 1) {
                if (uVar7 == uVar11) {
                  iVar16 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                  iVar16 = iVar16 + -1;
                  iVar14 = -1;
                  iVar15 = -1;
                }
                else {
                  iVar15 = Imf_3_4::TiledInputFile::numYTiles(iVar9);
                  iVar16 = 0;
                  iVar14 = 1;
                }
                for (lVar43 = 0; iVar38 = Imf_3_4::TiledInputFile::numXLevels(), lVar43 < iVar38;
                    lVar43 = lVar43 + 1) {
                  iVar38 = Imf_3_4::TiledInputFile::levelWidth(iVar9);
                  iVar17 = Imf_3_4::TiledInputFile::levelHeight(iVar9);
                  Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                            ((Array2D<Imath_3_2::half> *)
                             (tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                             (long)tileXs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish * lVar42 * 6 + lVar43 * 6),
                             (long)iVar17,(long)iVar38);
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                       0xffffffff00000000;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  Imf_3_4::Slice::Slice
                            ((Slice *)&out,HALF,
                             (char *)(*(long *)(tileXs.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                               (long)tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * lVar42
                                               * 6 + lVar43 * 6 + 2) * -(long)iVar12 * 2 +
                                      *(long *)(tileXs.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                               (long)tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * lVar42
                                               * 6 + lVar43 * 6 + 4) + (long)iVar10 * -2),2,
                             (long)iVar38 * 2,1,1,0.0,false,false);
                  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5faf);
                  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)&tileYs);
                  for (iVar38 = iVar16; iVar38 != iVar15; iVar38 = iVar38 + iVar14) {
                    for (iVar17 = 0; iVar19 = Imf_3_4::TiledInputFile::numXTiles(iVar9),
                        iVar17 < iVar19; iVar17 = iVar17 + 1) {
                      Imf_3_4::TiledInputFile::readTile(iVar9,iVar17,iVar38,(int)lVar43);
                    }
                  }
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)&fb);
                }
              }
              std::operator<<((ostream *)&std::cout," comparing");
              std::ostream::flush();
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,600,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              pBVar26 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
              bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar25,pBVar26);
              if (!bVar5) {
                __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x259,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::pixelAspectRatio();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25a,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
              pfVar28 = (float *)Imf_3_4::Header::screenWindowCenter();
              if ((((*pfVar27 != *pfVar28) || (NAN(*pfVar27) || NAN(*pfVar28))) ||
                  (pfVar27[1] != pfVar28[1])) || (NAN(pfVar27[1]) || NAN(pfVar28[1]))) {
                __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25c,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              fVar46 = *pfVar27;
              pfVar27 = (float *)Imf_3_4::Header::screenWindowWidth();
              if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25d,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::lineOrder();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25e,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              piVar24 = (int *)Imf_3_4::Header::compression();
              iVar10 = *piVar24;
              piVar24 = (int *)Imf_3_4::Header::compression();
              if (iVar10 != *piVar24) {
                __assert_fail("in.header ().compression () == hdr.compression ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x25f,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              Imf_3_4::TiledInputFile::header();
              pCVar29 = (ChannelList *)Imf_3_4::Header::channels();
              pCVar30 = (ChannelList *)Imf_3_4::Header::channels();
              cVar6 = Imf_3_4::ChannelList::operator==(pCVar29,pCVar30);
              if (cVar6 == '\0') {
                __assert_fail("in.header ().channels () == hdr.channels ()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                              ,0x260,
                              "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                             );
              }
              uVar41 = (ulong)uVar13;
              if ((int)uVar13 < 1) {
                uVar41 = 0;
              }
              uVar33 = (ulong)uVar18;
              if ((int)uVar18 < 1) {
                uVar33 = 0;
              }
              for (uVar44 = 0; uVar44 != uVar33; uVar44 = uVar44 + 1) {
                for (uVar45 = 0; uVar45 != uVar41; uVar45 = uVar45 + 1) {
                  lVar42 = 0;
                  for (lVar43 = 0; iVar10 = Imf_3_4::TiledInputFile::levelHeight(iVar9),
                      lVar43 < iVar10; lVar43 = lVar43 + 1) {
                    lVar40 = 0;
                    while (iVar10 = Imf_3_4::TiledInputFile::levelWidth(iVar9), lVar40 < iVar10) {
                      fVar46 = *(float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + (long)tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * uVar44
                                                  * 6 + uVar45 * 6 + 2) * lVar42 +
                                                  *(long *)(tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + (long)tileXs.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish * uVar44
                                                  * 6 + uVar45 * 6 + 4) + lVar40 * 2) * 4);
                      lVar37 = lVar40 * 2;
                      lVar40 = lVar40 + 1;
                      pfVar27 = (float *)(_imath_half_to_float_table +
                                         (ulong)*(ushort *)
                                                 (*(long *)(ph1._data +
                                                           ph1._sizeY * uVar44 * 0xc +
                                                           uVar45 * 0xc + 4) * lVar42 +
                                                  *(long *)(ph1._data +
                                                           ph1._sizeY * uVar44 * 0xc +
                                                           uVar45 * 0xc + 8) + lVar37) * 4);
                      if ((fVar46 != *pfVar27) || (NAN(fVar46) || NAN(*pfVar27))) {
                        __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                                      ,0x267,
                                      "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                                     );
                      }
                    }
                    lVar42 = lVar42 + 2;
                  }
                }
              }
              Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                        ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&tileXs);
              Imf_3_4::TiledInputFile::~TiledInputFile((TiledInputFile *)&tileYs);
              remove(_Var4._M_p);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                        ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)&ph1);
              Imf_3_4::Header::~Header(&hdr);
            }
          }
        }
      }
    }
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

void
writeCopyRead (const std::string& tempDir, int w, int h, int xs, int ys)
{
    std::string filename = tempDir + "imf_test_copy.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        if (comp == B44_COMPRESSION || comp == B44A_COMPRESSION) { continue; }

        for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
        {
            for (int rmode = 0; rmode < NUM_ROUNDINGMODES; ++rmode)
            {
                for (int tb = 0; tb <= 1; ++tb)
                {
                    for (int ts = 0; ts <= 1; ++ts)
                    {
                        writeCopyReadONE (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadMIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);

                        writeCopyReadRIP (
                            filename.c_str (),
                            w,
                            h,
                            (LineOrder) lorder,
                            (LevelRoundingMode) rmode,
                            xs,
                            ys,
                            Compression (comp),
                            (bool) tb,
                            (bool) ts);
                    }
                }
            }
        }
    }
}